

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<unsigned_char,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,uchar *params,char (*params_1) [2])

{
  CappedArray<char,_5UL> CVar1;
  CappedArray<char,_5UL> local_38;
  size_t local_28;
  undefined4 local_20;
  char local_1c;
  
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(uchar)*this);
  local_28 = CVar1.currentSize;
  local_20 = CVar1.content._0_4_;
  local_1c = CVar1.content[4];
  local_38._8_8_ = strlen((char *)params);
  local_38.currentSize = (size_t)params;
  _::concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}